

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::TestSpec::Filter::matches(Filter *this,TestCaseInfo *testCase)

{
  bool bVar1;
  uint uVar2;
  reference puVar3;
  Pattern *pPVar4;
  unique_ptr<Catch::TestSpec::Pattern> *pattern_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1_1;
  unique_ptr<Catch::TestSpec::Pattern> *pattern;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1;
  bool should_use;
  TestCaseInfo *testCase_local;
  Filter *this_local;
  
  bVar1 = TestCaseInfo::isHidden(testCase);
  __range1._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  __end1 = std::
           vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ::begin(&this->m_required);
  pattern = (unique_ptr<Catch::TestSpec::Pattern> *)
            std::
            vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
            ::end(&this->m_required);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
                                *)&pattern);
    if (!bVar1) {
      __end1_1 = std::
                 vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
                 ::begin(&this->m_forbidden);
      pattern_1 = (unique_ptr<Catch::TestSpec::Pattern> *)
                  std::
                  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
                  ::end(&this->m_forbidden);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
                            *)&pattern_1);
        if (!bVar1) {
          return __range1._7_1_;
        }
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
                 ::operator*(&__end1_1);
        pPVar4 = Detail::unique_ptr<Catch::TestSpec::Pattern>::operator->(puVar3);
        uVar2 = (*pPVar4->_vptr_Pattern[2])(pPVar4,testCase);
        if ((uVar2 & 1) != 0) break;
        __gnu_cxx::
        __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
        ::operator++(&__end1_1);
      }
      return false;
    }
    puVar3 = __gnu_cxx::
             __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
             ::operator*(&__end1);
    __range1._7_1_ = true;
    pPVar4 = Detail::unique_ptr<Catch::TestSpec::Pattern>::operator->(puVar3);
    uVar2 = (*pPVar4->_vptr_Pattern[2])(pPVar4,testCase);
    if ((uVar2 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool TestSpec::Filter::matches( TestCaseInfo const& testCase ) const {
        bool should_use = !testCase.isHidden();
        for (auto const& pattern : m_required) {
            should_use = true;
            if (!pattern->matches(testCase)) {
                return false;
            }
        }
        for (auto const& pattern : m_forbidden) {
            if (pattern->matches(testCase)) {
                return false;
            }
        }
        return should_use;
    }